

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_option_opts_abi_cxx11_(Formatter *this,Option *opt)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  reference ppOVar6;
  Option *in_RDX;
  string *in_RDI;
  Option *op_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3_1;
  Option *op;
  iterator __end3;
  iterator __begin3;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3;
  stringstream out;
  Option *in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  string *in_stack_fffffffffffffa40;
  FormatterBase *in_stack_fffffffffffffa48;
  allocator<char> *in_stack_fffffffffffffa50;
  ostream *in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  string local_4f0 [32];
  Option *local_4d0;
  _Self local_4c8;
  _Self local_4c0;
  undefined1 local_4b8 [48];
  undefined1 *local_488;
  allocator<char> local_479 [33];
  string local_458 [80];
  string local_408 [32];
  Option *local_3e8;
  _Self local_3e0;
  _Self local_3d8;
  undefined1 local_3d0 [48];
  undefined1 *local_3a0;
  allocator<char> local_391 [33];
  string local_370 [80];
  string local_320 [39];
  allocator<char> local_2f9 [33];
  string local_2d8 [62];
  undefined1 in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  Option *in_stack_fffffffffffffd68;
  string local_270 [32];
  string local_250 [96];
  string local_1f0 [80];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  Option *local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  Option::get_option_text_abi_cxx11_(local_18);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x190fe3);
  if (bVar1) {
    iVar3 = Option::get_type_size(local_18);
    if (iVar3 != 0) {
      Option::get_type_name_abi_cxx11_
                ((Option *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x19109b);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar4 = ::std::operator<<(local_190," ");
        Option::get_type_name_abi_cxx11_
                  ((Option *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
        ::std::operator<<(poVar4,local_1f0);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      }
      Option::get_default_str_abi_cxx11_(in_stack_fffffffffffffa18);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1911b5);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar4 = ::std::operator<<(local_190," [");
        Option::get_default_str_abi_cxx11_(in_stack_fffffffffffffa18);
        poVar4 = ::std::operator<<(poVar4,local_250);
        ::std::operator<<(poVar4,"] ");
        ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      }
      iVar3 = Option::get_expected_max(local_18);
      if (iVar3 == 0x20000000) {
        ::std::operator<<(local_190," ...");
      }
      else {
        iVar3 = Option::get_expected_min(local_18);
        if (1 < iVar3) {
          poVar4 = ::std::operator<<(local_190," x ");
          iVar3 = Option::get_expected(local_18);
          ::std::ostream::operator<<(poVar4,iVar3);
        }
      }
      bVar1 = OptionBase<CLI::Option>::get_required(&local_18->super_OptionBase<CLI::Option>);
      if (bVar1) {
        poVar4 = ::std::operator<<(local_190," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                   (char *)in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
        FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
        ::std::operator<<(poVar4,local_270);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
        ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd6f);
      }
    }
    Option::get_envname_abi_cxx11_(in_stack_fffffffffffffa18);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19145e
                      );
    ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar4 = ::std::operator<<(local_190," (");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                 (char *)in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      poVar4 = ::std::operator<<(poVar4,local_2d8);
      poVar4 = ::std::operator<<(poVar4,":");
      Option::get_envname_abi_cxx11_(in_stack_fffffffffffffa18);
      poVar4 = ::std::operator<<(poVar4,local_320);
      ::std::operator<<(poVar4,")");
      ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      ::std::allocator<char>::~allocator(local_2f9);
    }
    Option::get_needs(in_stack_fffffffffffffa18);
    bVar1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                      ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                        *)0x191645);
    bVar2 = bVar1 ^ 0xff;
    std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
              ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
               0x191658);
    if ((bVar2 & 1) != 0) {
      in_stack_fffffffffffffa58 = ::std::operator<<(local_190," ");
      in_stack_fffffffffffffa50 = local_391;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffa60),(char *)in_stack_fffffffffffffa58,
                 in_stack_fffffffffffffa50);
      FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      in_stack_fffffffffffffa48 =
           (FormatterBase *)::std::operator<<(in_stack_fffffffffffffa58,local_370);
      ::std::operator<<((ostream *)in_stack_fffffffffffffa48,":");
      ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      ::std::allocator<char>::~allocator((allocator<char> *)local_391);
      Option::get_needs(in_stack_fffffffffffffa18);
      local_3a0 = local_3d0;
      local_3d8._M_node =
           (_Base_ptr)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::begin
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)in_stack_fffffffffffffa18);
      local_3e0._M_node =
           (_Base_ptr)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)in_stack_fffffffffffffa18);
      while (bVar1 = std::operator==(&local_3d8,&local_3e0), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppOVar6 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*
                            ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffa20);
        local_3e8 = *ppOVar6;
        in_stack_fffffffffffffa40 = (string *)::std::operator<<(local_190," ");
        Option::get_name_abi_cxx11_
                  (in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67,
                   (bool)in_stack_fffffffffffffd66);
        ::std::operator<<((ostream *)in_stack_fffffffffffffa40,local_408);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffa20);
        std::_Rb_tree_const_iterator<CLI::Option_*>::operator++
                  ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffa20);
      }
      std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
                ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                 0x191798);
    }
    Option::get_excludes(in_stack_fffffffffffffa18);
    bVar1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                      ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                        *)0x1918f9);
    std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
              ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
               0x19190c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar4 = ::std::operator<<(local_190," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffa60),(char *)in_stack_fffffffffffffa58,
                 in_stack_fffffffffffffa50);
      FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ::std::operator<<(poVar4,local_458);
      ::std::operator<<((ostream *)this_00,":");
      ::std::__cxx11::string::~string(this_00);
      ::std::__cxx11::string::~string(this_00);
      ::std::allocator<char>::~allocator(local_479);
      Option::get_excludes(in_stack_fffffffffffffa18);
      local_488 = local_4b8;
      local_4c0._M_node =
           (_Base_ptr)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::begin
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)in_stack_fffffffffffffa18);
      local_4c8._M_node =
           (_Base_ptr)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)in_stack_fffffffffffffa18);
      while (bVar1 = std::operator==(&local_4c0,&local_4c8), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppOVar6 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*
                            ((_Rb_tree_const_iterator<CLI::Option_*> *)this_00);
        local_4d0 = *ppOVar6;
        poVar4 = ::std::operator<<(local_190," ");
        Option::get_name_abi_cxx11_
                  (in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67,
                   (bool)in_stack_fffffffffffffd66);
        ::std::operator<<(poVar4,local_4f0);
        ::std::__cxx11::string::~string(this_00);
        std::_Rb_tree_const_iterator<CLI::Option_*>::operator++
                  ((_Rb_tree_const_iterator<CLI::Option_*> *)this_00);
      }
      std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
                ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                 0x191a4c);
    }
  }
  else {
    poVar4 = ::std::operator<<(local_190," ");
    psVar5 = Option::get_option_text_abi_cxx11_(local_18);
    ::std::operator<<(poVar4,(string *)psVar5);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_opts(const Option *opt) const {
    std::stringstream out;

    if(!opt->get_option_text().empty()) {
        out << " " << opt->get_option_text();
    } else {
        if(opt->get_type_size() != 0) {
            if(!opt->get_type_name().empty())
                out << " " << get_label(opt->get_type_name());
            if(!opt->get_default_str().empty())
                out << " [" << opt->get_default_str() << "] ";
            if(opt->get_expected_max() == detail::expected_max_vector_size)
                out << " ...";
            else if(opt->get_expected_min() > 1)
                out << " x " << opt->get_expected();

            if(opt->get_required())
                out << " " << get_label("REQUIRED");
        }
        if(!opt->get_envname().empty())
            out << " (" << get_label("Env") << ":" << opt->get_envname() << ")";
        if(!opt->get_needs().empty()) {
            out << " " << get_label("Needs") << ":";
            for(const Option *op : opt->get_needs())
                out << " " << op->get_name();
        }
        if(!opt->get_excludes().empty()) {
            out << " " << get_label("Excludes") << ":";
            for(const Option *op : opt->get_excludes())
                out << " " << op->get_name();
        }
    }
    return out.str();
}